

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

int __thiscall Layer_c_api::forward(Layer_c_api *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat *pMVar5;
  int iVar6;
  ncnn_mat_t top_blob0;
  Mat *local_20;
  
  local_20 = (Mat *)0x0;
  iVar6 = (*this->layer->forward_1)
                    (this->layer,(ncnn_mat_t)bottom_blob,(ncnn_mat_t *)&local_20,(ncnn_option_t)opt)
  ;
  pMVar5 = local_20;
  if (local_20 != top_blob) {
    piVar1 = local_20->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar1 = pMVar5->refcount;
    top_blob->data = pMVar5->data;
    top_blob->refcount = piVar1;
    top_blob->elemsize = pMVar5->elemsize;
    top_blob->elempack = pMVar5->elempack;
    top_blob->allocator = pMVar5->allocator;
    iVar2 = pMVar5->w;
    iVar3 = pMVar5->h;
    iVar4 = pMVar5->d;
    top_blob->dims = pMVar5->dims;
    top_blob->w = iVar2;
    top_blob->h = iVar3;
    top_blob->d = iVar4;
    top_blob->c = pMVar5->c;
    top_blob->cstep = pMVar5->cstep;
  }
  ncnn_mat_destroy((ncnn_mat_t)local_20);
  return iVar6;
}

Assistant:

virtual int forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
    {
        ncnn_mat_t top_blob0 = 0;
        int ret = layer->forward_1(layer, (ncnn_mat_t)&bottom_blob, &top_blob0, (ncnn_option_t)&opt);
        top_blob = *(Mat*)top_blob0;
        ncnn_mat_destroy(top_blob0);
        return ret;
    }